

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O1

Vec3 __thiscall
anon_unknown.dwarf_5f851::MapDriver::predictFuturePosition(MapDriver *this,float predictionTime)

{
  Color *in_R8;
  uint uVar1;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar2;
  float extraout_XMM0_Da_01;
  float fVar3;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  float extraout_XMM0_Db_02;
  float extraout_XMM0_Db_03;
  float extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float in_XMM1_Da;
  float fVar4;
  undefined8 uVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  Vec3 VVar9;
  Color futurePositionColor;
  Vec3 local_58;
  undefined1 local_48 [16];
  Vec3 local_38;
  Color local_28;
  
  if (this->curvedSteering == true) {
    fVar3 = (this->super_SimpleVehicle)._curvature;
    fVar4 = 1.0 / fVar3;
    uVar1 = -(uint)(ABS(fVar3) < 1e-05);
    fVar6 = (float)(~uVar1 & (uint)fVar4 | uVar1 & 0x47c35000);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[2])(this);
    in_XMM1_Da = fVar4 * fVar6;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    local_58.x = fVar6 * extraout_XMM0_Da + extraout_XMM0_Da_00;
    local_58.y = fVar6 * extraout_XMM0_Db + extraout_XMM0_Db_00;
    in_XMM1_Da = in_XMM1_Da + fVar4 * fVar6;
    fVar3 = (float)(&DAT_0014a100)[fVar6 < 0.0];
    fVar2 = fVar6 * fVar3 * -6.2831855;
    fVar4 = fVar3;
    local_58.z = in_XMM1_Da;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x1b])(this);
    fVar3 = extraout_XMM0_Da_01 * predictionTime * fVar3;
    fVar6 = fVar2 * 0.25;
    if (fVar3 <= 0.0) {
      fVar4 = (float)((uint)-fVar6 & -(uint)(fVar6 < -fVar3));
      auVar7._0_4_ = ~-(uint)(fVar6 < -fVar3) & (uint)fVar3;
      auVar7._4_4_ = extraout_XMM0_Db_01;
      auVar7._8_4_ = extraout_XMM0_Dc;
      auVar7._12_4_ = extraout_XMM0_Dd;
      local_48 = auVar7 | ZEXT416((uint)fVar4);
    }
    else {
      if (fVar3 <= fVar6) {
        fVar6 = fVar3;
      }
      local_48 = ZEXT416((uint)fVar6);
    }
    fVar2 = (local_48._0_4_ * 6.2831855) / fVar2;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar3 = sinf(fVar2);
    fVar6 = cosf(fVar2);
    fVar2 = (extraout_XMM0_Da_04 - local_58.x) * fVar6 + (fVar4 - in_XMM1_Da) * fVar3 + local_58.x;
    fVar8 = (extraout_XMM0_Db_04 - local_58.y) + local_58.y;
    in_XMM1_Da = ((fVar4 - in_XMM1_Da) * fVar6 - fVar3 * (extraout_XMM0_Da_04 - local_58.x)) +
                 in_XMM1_Da;
    fVar3 = 0.5;
    OpenSteer::Color::Color(&local_28,0.5,0.5,0.6,1.0);
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    local_38.z = fVar3;
    annotationXZArc(this,&local_38,&local_58,(float)local_48._0_4_,(int)&local_28,in_R8);
    uVar5 = CONCAT44(fVar8,fVar2);
  }
  else {
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[8])(this);
    fVar3 = in_XMM1_Da;
    (*(this->super_SimpleVehicle).super_SimpleVehicle_3.
      super_AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>.
      super_LocalSpaceMixin<OpenSteer::AbstractVehicle>.super_AbstractVehicle.
      super_AbstractLocalSpace._vptr_AbstractLocalSpace[0x1a])(this);
    uVar5 = CONCAT44(predictionTime * extraout_XMM0_Db_03 + extraout_XMM0_Db_02,
                     predictionTime * extraout_XMM0_Da_03 + extraout_XMM0_Da_02);
    in_XMM1_Da = fVar3 * predictionTime + in_XMM1_Da;
  }
  VVar9.z = in_XMM1_Da;
  VVar9.x = (float)(int)uVar5;
  VVar9.y = (float)(int)((ulong)uVar5 >> 0x20);
  return VVar9;
}

Assistant:

Vec3 predictFuturePosition (const float predictionTime) const
        {
            if (curvedSteering)
            {
                // QQQ this chunk of code is repeated in far too many places,
                // QQQ it has to be moved inside some utility
                // QQQ 
                // QQQ and now, worse, I rearranged it to try the "limit arc
                // QQQ angle" trick
                const float signedRadius = 1 / nonZeroCurvatureQQQ ();
                const Vec3 localCenterOfCurvature = side () * signedRadius;
                const Vec3 center = position () + localCenterOfCurvature;
                const float sign = signedRadius < 0 ? 1.0f : -1.0f;
                const float arcRadius = signedRadius * -sign;
                const float twoPi = 2 * OPENSTEER_M_PI;
                const float circumference = twoPi * arcRadius;
                const float rawLength = speed() * predictionTime * sign;
                const float arcLength = arcLengthLimit (rawLength,
                                                        circumference * 0.25f);
                const float arcAngle = twoPi * arcLength / circumference;

                const Vec3 spoke = position () - center;
                const Vec3 newSpoke = spoke.rotateAboutGlobalY (arcAngle);
                const Vec3 prediction = newSpoke + center;

                // QQQ unify with annotatePathFollowing
                const Color futurePositionColor (0.5f, 0.5f, 0.6f);
                annotationXZArc (position (), center, arcLength, 20, 
                                 futurePositionColor);
                return prediction;
            }
            else
            {
                return position() + (velocity() * predictionTime);
            }
        }